

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_in_out.cpp
# Opt level: O3

OperatorResultType
ThrottlingSum::Function
          (ExecutionContext *context,TableFunctionInput *data_p,DataChunk *input,DataChunk *output)

{
  iterator __position;
  DataChunk *pDVar1;
  char cVar2;
  int iVar3;
  reference pvVar4;
  reference pvVar5;
  long lVar6;
  size_type __n;
  long lVar7;
  ulong uVar8;
  Value *pVVar9;
  Value *pVVar10;
  int sum;
  int local_94;
  long local_90;
  DataChunk *local_88;
  ExecutionContext *local_80;
  vector<int,std::allocator<int>> *local_78;
  LogicalType local_70 [64];
  
  local_88 = output;
  local_80 = context;
  duckdb::optional_ptr<duckdb::LocalTableFunctionState,_true>::CheckValid
            ((optional_ptr<duckdb::LocalTableFunctionState,_true> *)(data_p + 8));
  lVar7 = *(long *)(data_p + 8);
  local_90 = lVar7;
  if (*(long *)(input + 0x18) != 0) {
    local_78 = (vector<int,std::allocator<int>> *)(lVar7 + 8);
    uVar8 = 0;
    do {
      local_94 = 0;
      if (*(long *)(input + 8) != *(long *)input) {
        __n = 0;
        do {
          pvVar4 = duckdb::vector<duckdb::Vector,_true>::operator[]
                             ((vector<duckdb::Vector,_true> *)input,__n);
          duckdb::LogicalType::LogicalType(local_70,INTEGER);
          cVar2 = duckdb::LogicalType::operator==((LogicalType *)(pvVar4 + 8),local_70);
          duckdb::LogicalType::~LogicalType(local_70);
          if (cVar2 != '\0') {
            duckdb::vector<duckdb::Vector,_true>::operator[]
                      ((vector<duckdb::Vector,_true> *)input,__n);
            duckdb::Vector::GetValue((ulong)local_70);
            iVar3 = duckdb::Value::GetValue<int>();
            local_94 = local_94 + iVar3;
            duckdb::Value::~Value((Value *)local_70);
          }
          __n = __n + 1;
        } while (__n < (ulong)((*(long *)(input + 8) - *(long *)input >> 3) * 0x4ec4ec4ec4ec4ec5));
      }
      lVar7 = local_90;
      __position._M_current = *(int **)(local_90 + 0x10);
      if (__position._M_current == *(int **)(local_90 + 0x18)) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  (local_78,__position,&local_94);
      }
      else {
        *__position._M_current = local_94;
        *(int **)(local_90 + 0x10) = __position._M_current + 1;
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < *(ulong *)(input + 0x18));
  }
  cVar2 = duckdb::PhysicalOperator::OperatorCachingAllowed(local_80);
  pDVar1 = local_88;
  if (cVar2 == '\0') {
    lVar6 = *(long *)(lVar7 + 0x10) - *(long *)(lVar7 + 8) >> 2;
    pVVar9 = (Value *)(lVar6 - *(long *)(lVar7 + 0x20));
    if (pVVar9 != (Value *)0x0) {
      pVVar10 = (Value *)0x0;
      do {
        pvVar5 = duckdb::vector<int,_true>::operator[]
                           ((vector<int,_true> *)(lVar7 + 8),
                            (size_type)(pVVar10 + *(long *)(local_90 + 0x20)));
        duckdb::Value::Value((Value *)local_70,*pvVar5);
        duckdb::DataChunk::SetValue((ulong)pDVar1,0,pVVar10);
        duckdb::Value::~Value((Value *)local_70);
        pVVar10 = pVVar10 + 1;
      } while (pVVar9 != pVVar10);
      lVar6 = *(long *)(local_90 + 0x20);
      lVar7 = local_90;
    }
    *(Value **)(lVar7 + 0x20) = pVVar9 + lVar6;
    *(Value **)(pDVar1 + 0x18) = pVVar9;
  }
  else {
    uVar8 = *(ulong *)(lVar7 + 0x20);
    if (uVar8 < (ulong)(*(long *)(lVar7 + 0x10) - *(long *)(lVar7 + 8) >> 2)) {
      *(undefined8 *)(local_88 + 0x18) = 1;
      *(ulong *)(lVar7 + 0x20) = uVar8 + 1;
      pvVar5 = duckdb::vector<int,_true>::operator[]((vector<int,_true> *)(lVar7 + 8),uVar8);
      duckdb::Value::Value((Value *)local_70,*pvVar5);
      duckdb::DataChunk::SetValue((ulong)pDVar1,0,(Value *)0x0);
      duckdb::Value::~Value((Value *)local_70);
    }
    else {
      *(undefined8 *)(local_88 + 0x18) = 0;
    }
  }
  return NEED_MORE_INPUT;
}

Assistant:

static OperatorResultType Function(ExecutionContext &context, TableFunctionInput &data_p, DataChunk &input,
	                                   DataChunk &output) {
		auto &local_state = data_p.local_state->Cast<ThrottlingSum::ThrottlingSumLocalData>();

		for (idx_t row_idx = 0; row_idx < input.size(); row_idx++) {
			int sum = 0;
			for (idx_t col_idx = 0; col_idx < input.ColumnCount(); col_idx++) {
				if (input.data[col_idx].GetType() == LogicalType::INTEGER) {
					sum += input.data[col_idx].GetValue(row_idx).GetValue<int>();
				}
			}
			local_state.row_sums.push_back(sum);
		}

		if (PhysicalOperator::OperatorCachingAllowed(context)) {
			// Caching is allowed
			if (local_state.current_idx < local_state.row_sums.size()) {
				output.SetCardinality(1);
				output.SetValue(0, 0, Value(local_state.row_sums[local_state.current_idx++]));
			} else {
				output.SetCardinality(0);
			}
		} else {
			// Caching is not allowed, we should emit everything!
			auto to_emit = local_state.row_sums.size() - local_state.current_idx;
			for (idx_t i = 0; i < to_emit; i++) {
				output.SetValue(0, i, Value(local_state.row_sums[local_state.current_idx + i]));
			}
			local_state.current_idx += to_emit;
			output.SetCardinality(to_emit);
		}

		return OperatorResultType::NEED_MORE_INPUT;
	}